

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

bool cmCTestScriptHandler::RunScript
               (cmCTest *ctest,cmMakefile *mf,string *sname,bool InProcess,int *returnValue)

{
  int iVar1;
  cmCTestScriptHandler *in_RAX;
  pointer *__ptr;
  
  std::make_unique<cmCTestScriptHandler>();
  (in_RAX->super_cmCTestGenericHandler).CTest = ctest;
  in_RAX->ParentMakefile = mf;
  AddConfigurationScript(in_RAX,sname,InProcess);
  iVar1 = (*(in_RAX->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[1])();
  if (returnValue != (int *)0x0) {
    *returnValue = iVar1;
  }
  if (in_RAX != (cmCTestScriptHandler *)0x0) {
    (*(in_RAX->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[5])();
  }
  return true;
}

Assistant:

bool cmCTestScriptHandler::RunScript(cmCTest* ctest, cmMakefile* mf,
                                     const std::string& sname, bool InProcess,
                                     int* returnValue)
{
  auto sh = cm::make_unique<cmCTestScriptHandler>();
  sh->SetCTestInstance(ctest);
  sh->ParentMakefile = mf;
  sh->AddConfigurationScript(sname, InProcess);
  int res = sh->ProcessHandler();
  if (returnValue) {
    *returnValue = res;
  }
  return true;
}